

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O1

void jpeg_simple_progression(j_compress_ptr cinfo)

{
  int ncomps;
  jpeg_error_mgr *pjVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  jpeg_scan_info *pjVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar7 = cinfo->global_state;
  ncomps = cinfo->num_components;
  if (iVar7 != 100) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x15;
    (pjVar1->msg_parm).i[0] = iVar7;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((ncomps != 3) || (uVar6 = 10, cinfo->jpeg_color_space != JCS_YCbCr)) {
    if (ncomps < 5) {
      uVar6 = ncomps * 4 + 2;
    }
    else {
      uVar6 = ncomps * 6;
    }
  }
  if ((cinfo->script_space == (jpeg_scan_info *)0x0) || (cinfo->script_space_size < (int)uVar6)) {
    uVar3 = 10;
    if (10 < (int)uVar6) {
      uVar3 = (ulong)uVar6;
    }
    cinfo->script_space_size = (int)uVar3;
    pjVar4 = (jpeg_scan_info *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,uVar3 * 0x24);
    cinfo->script_space = pjVar4;
  }
  pjVar4 = cinfo->script_space;
  cinfo->scan_info = pjVar4;
  cinfo->num_scans = uVar6;
  if ((ncomps == 3) && (cinfo->jpeg_color_space == JCS_YCbCr)) {
    pjVar4->comps_in_scan = 3;
    auVar2 = _DAT_001ed2b0;
    lVar5 = 0;
    auVar10 = _DAT_001ed2a0;
    do {
      auVar9 = auVar10 ^ auVar2;
      if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffffd) {
        pjVar4->component_index[lVar5] = (int)lVar5;
        pjVar4->component_index[lVar5 + 1] = (int)lVar5 + 1;
      }
      lVar5 = lVar5 + 2;
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
    } while (lVar5 != 4);
    pjVar4->Ss = 0;
    pjVar4->Se = 0;
    pjVar4->Ah = 0;
    pjVar4->Al = 1;
    pjVar4[1].comps_in_scan = 1;
    pjVar4[1].component_index[0] = 0;
    pjVar4[1].Ss = 1;
    pjVar4[1].Se = 5;
    pjVar4[1].Ah = 0;
    pjVar4[1].Al = 2;
    pjVar4[2].comps_in_scan = 1;
    pjVar4[2].component_index[0] = 2;
    pjVar4[2].Ss = 1;
    pjVar4[2].Se = 0x3f;
    pjVar4[2].Ah = 0;
    pjVar4[2].Al = 1;
    pjVar4[3].comps_in_scan = 1;
    pjVar4[3].component_index[0] = 1;
    pjVar4[3].Ss = 1;
    pjVar4[3].Se = 0x3f;
    pjVar4[3].Ah = 0;
    pjVar4[3].Al = 1;
    pjVar4[4].comps_in_scan = 1;
    pjVar4[4].component_index[0] = 0;
    pjVar4[4].Ss = 6;
    pjVar4[4].Se = 0x3f;
    pjVar4[4].Ah = 0;
    pjVar4[4].Al = 2;
    pjVar4[5].comps_in_scan = 1;
    pjVar4[5].component_index[0] = 0;
    pjVar4[5].Ss = 1;
    pjVar4[5].Se = 0x3f;
    pjVar4[5].Ah = 2;
    pjVar4[5].Al = 1;
    pjVar4[6].comps_in_scan = 3;
    lVar5 = 0;
    auVar9 = _DAT_001ed2a0;
    do {
      auVar10 = auVar9 ^ auVar2;
      if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7ffffffd) {
        pjVar4[6].component_index[lVar5] = (int)lVar5;
        pjVar4[6].component_index[lVar5 + 1] = (int)lVar5 + 1;
      }
      lVar5 = lVar5 + 2;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar8 + 2;
    } while (lVar5 != 4);
    pjVar4[6].Ss = 0;
    pjVar4[6].Se = 0;
    pjVar4[6].Ah = 1;
    pjVar4[6].Al = 0;
    pjVar4[7].comps_in_scan = 1;
    pjVar4[7].component_index[0] = 2;
    pjVar4[7].Ss = 1;
    pjVar4[7].Se = 0x3f;
    pjVar4[7].Ah = 1;
    pjVar4[7].Al = 0;
    pjVar4[8].comps_in_scan = 1;
    pjVar4[8].component_index[0] = 1;
    pjVar4[8].Ss = 1;
    pjVar4[8].Se = 0x3f;
    pjVar4[8].Ah = 1;
    pjVar4[8].Al = 0;
    pjVar4[9].comps_in_scan = 1;
    pjVar4[9].component_index[0] = 0;
    pjVar4[9].Ss = 1;
    pjVar4[9].Se = 0x3f;
    pjVar4[9].Ah = 1;
    pjVar4[9].Al = 0;
  }
  else {
    iVar7 = 0;
    pjVar4 = fill_dc_scans(pjVar4,ncomps,0,1);
    if (0 < ncomps) {
      do {
        pjVar4->comps_in_scan = 1;
        pjVar4->component_index[0] = iVar7;
        pjVar4->Ss = 1;
        pjVar4->Se = 5;
        pjVar4->Ah = 0;
        pjVar4->Al = 2;
        pjVar4 = pjVar4 + 1;
        iVar7 = iVar7 + 1;
      } while (ncomps != iVar7);
    }
    if (0 < ncomps) {
      iVar7 = 0;
      do {
        pjVar4->comps_in_scan = 1;
        pjVar4->component_index[0] = iVar7;
        pjVar4->Ss = 6;
        pjVar4->Se = 0x3f;
        pjVar4->Ah = 0;
        pjVar4->Al = 2;
        pjVar4 = pjVar4 + 1;
        iVar7 = iVar7 + 1;
      } while (ncomps != iVar7);
    }
    if (0 < ncomps) {
      iVar7 = 0;
      do {
        pjVar4->comps_in_scan = 1;
        pjVar4->component_index[0] = iVar7;
        pjVar4->Ss = 1;
        pjVar4->Se = 0x3f;
        pjVar4->Ah = 2;
        pjVar4->Al = 1;
        pjVar4 = pjVar4 + 1;
        iVar7 = iVar7 + 1;
      } while (ncomps != iVar7);
    }
    iVar7 = 0;
    pjVar4 = fill_dc_scans(pjVar4,ncomps,1,0);
    if (0 < ncomps) {
      do {
        pjVar4->comps_in_scan = 1;
        pjVar4->component_index[0] = iVar7;
        pjVar4->Ss = 1;
        pjVar4->Se = 0x3f;
        pjVar4->Ah = 1;
        pjVar4->Al = 0;
        pjVar4 = pjVar4 + 1;
        iVar7 = iVar7 + 1;
      } while (ncomps != iVar7);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_simple_progression (j_compress_ptr cinfo)
{
  int ncomps = cinfo->num_components;
  int nscans;
  jpeg_scan_info * scanptr;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Figure space needed for script.  Calculation must match code below! */
  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    nscans = 10;
  } else {
    /* All-purpose script for other color spaces. */
    if (ncomps > MAX_COMPS_IN_SCAN)
      nscans = 6 * ncomps;	/* 2 DC + 4 AC scans per component */
    else
      nscans = 2 + 4 * ncomps;	/* 2 DC scans; 4 AC scans per component */
  }

  /* Allocate space for script.
   * We need to put it in the permanent pool in case the application performs
   * multiple compressions without changing the settings.  To avoid a memory
   * leak if jpeg_simple_progression is called repeatedly for the same JPEG
   * object, we try to re-use previously allocated space, and we allocate
   * enough space to handle YCbCr even if initially asked for grayscale.
   */
  if (cinfo->script_space == NULL || cinfo->script_space_size < nscans) {
    cinfo->script_space_size = MAX(nscans, 10);
    cinfo->script_space = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
			cinfo->script_space_size * SIZEOF(jpeg_scan_info));
  }
  scanptr = cinfo->script_space;
  cinfo->scan_info = scanptr;
  cinfo->num_scans = nscans;

  if (ncomps == 3 && cinfo->jpeg_color_space == JCS_YCbCr) {
    /* Custom script for YCbCr color images. */
    /* Initial DC scan */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    /* Initial AC scan: get some luma data out in a hurry */
    scanptr = fill_a_scan(scanptr, 0, 1, 5, 0, 2);
    /* Chroma data is too small to be worth expending many scans on */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 0, 1);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 0, 1);
    /* Complete spectral selection for luma AC */
    scanptr = fill_a_scan(scanptr, 0, 6, 63, 0, 2);
    /* Refine next bit of luma AC */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 2, 1);
    /* Finish DC successive approximation */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    /* Finish AC successive approximation */
    scanptr = fill_a_scan(scanptr, 2, 1, 63, 1, 0);
    scanptr = fill_a_scan(scanptr, 1, 1, 63, 1, 0);
    /* Luma bottom bit comes last since it's usually largest scan */
    scanptr = fill_a_scan(scanptr, 0, 1, 63, 1, 0);
  } else {
    /* All-purpose script for other color spaces. */
    /* Successive approximation first pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 0, 1);
    scanptr = fill_scans(scanptr, ncomps, 1, 5, 0, 2);
    scanptr = fill_scans(scanptr, ncomps, 6, 63, 0, 2);
    /* Successive approximation second pass */
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 2, 1);
    /* Successive approximation final pass */
    scanptr = fill_dc_scans(scanptr, ncomps, 1, 0);
    scanptr = fill_scans(scanptr, ncomps, 1, 63, 1, 0);
  }
}